

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O2

int pnga_local_iterator_next(_iterator_hdl *hdl,Integer *plo,Integer *phi,char **ptr,Integer *ld)

{
  long *plVar1;
  long *plVar2;
  short sVar3;
  Integer *pIVar4;
  long lVar5;
  global_array_t *pgVar6;
  Integer IVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  
  lVar9 = hdl->g_a;
  iVar10 = GA[lVar9 + 1000].p_handle;
  IVar7 = pnga_pgroup_nodeid((long)iVar10);
  pgVar6 = GA;
  iVar13 = 1;
  if ((uint)GA[lVar9 + 1000].distr_type < 5) {
    sVar3 = GA[lVar9 + 1000].ndim;
    iVar13 = (int)sVar3;
    lVar11 = (long)iVar13;
    switch(GA[lVar9 + 1000].distr_type) {
    case 0:
      if (hdl->count < 1) {
        pnga_distribution(hdl->g_a,(long)(int)IVar7,plo,phi);
        if (sVar3 < 1) {
          iVar13 = 0;
        }
        lVar9 = 0;
        do {
          if (iVar13 == lVar9) {
            pnga_access_ptr(hdl->g_a,plo,phi,ptr,ld);
            lVar9 = 1;
            goto LAB_00128042;
          }
          plVar1 = phi + lVar9;
          plVar2 = plo + lVar9;
          lVar9 = lVar9 + 1;
        } while (*plVar2 <= *plVar1);
      }
      break;
    case 1:
      lVar9 = hdl->count;
      IVar7 = pnga_total_blocks(hdl->g_a);
      if (lVar9 < IVar7) {
        pnga_distribution(hdl->g_a,hdl->count,plo,phi);
        pnga_access_block_ptr(hdl->g_a,hdl->count,ptr,ld);
        lVar9 = pnga_pgroup_nnodes((long)iVar10);
LAB_00128042:
        hdl->count = hdl->count + lVar9;
        return 1;
      }
      break;
    default:
      if (hdl->proc_index[lVar11 + 6] < hdl->hibuf[lVar11 + 6]) {
        lVar9 = 0;
        iVar10 = 0;
        if (0 < sVar3) {
          iVar10 = iVar13;
        }
        for (; iVar10 != lVar9; lVar9 = lVar9 + 1) {
          plo[lVar9] = hdl->blk_size[lVar9] * hdl->index[lVar9] + 1;
          lVar8 = (hdl->index[lVar9] + 1) * hdl->blk_size[lVar9];
          phi[lVar9] = lVar8;
          if (hdl->blk_dim[lVar9] <= lVar8) {
            lVar8 = hdl->blk_dim[lVar9];
          }
          phi[lVar9] = lVar8;
        }
        pnga_access_block_grid_ptr(hdl->g_a,hdl->index,ptr,ld);
        hdl->index[0] = hdl->index[0] + hdl->blk_inc[0];
        for (lVar9 = 0; lVar9 != iVar10; lVar9 = lVar9 + 1) {
          if ((lVar9 < lVar11 + -1) && (hdl->blk_num[lVar9] <= hdl->index[lVar9])) {
            lVar8 = hdl->blk_inc[lVar9 + 1];
            hdl->index[lVar9] = hdl->proc_index[lVar9];
            hdl->index[lVar9 + 1] = hdl->index[lVar9 + 1] + lVar8;
          }
        }
        return 1;
      }
      break;
    case 4:
      if (hdl->proc_index[lVar11 + 6] < hdl->hibuf[lVar11 + 6]) {
        lVar8 = 0;
        if (sVar3 < 1) {
          iVar13 = 0;
        }
        for (lVar12 = 0x1aa14; lVar12 - iVar13 != 0x1aa14; lVar12 = lVar12 + 1) {
          pIVar4 = hdl->mapc;
          plo[lVar12 + -0x1aa14] = pIVar4[lVar8 + *(long *)((long)hdl + lVar12 * 8 + -0xd4dd8)];
          lVar5 = *(long *)((long)hdl + lVar12 * 8 + -0xd4dd8);
          if (lVar5 < *(long *)((long)hdl + lVar12 * 8 + -0xd4f60) + -1) {
            IVar7 = pIVar4[lVar8 + lVar5 + 1] + -1;
          }
          else {
            IVar7 = *(Integer *)((long)pgVar6 + lVar12 * 8 + lVar9 * 0x368 + -0x230);
          }
          phi[lVar12 + -0x1aa14] = IVar7;
          lVar8 = lVar8 + pgVar6[lVar9].dims[lVar12 + -6];
        }
        pnga_access_block_grid_ptr(hdl->g_a,hdl->index,ptr,ld);
        hdl->index[0] = hdl->index[0] + hdl->blk_inc[0];
        for (lVar9 = 0; lVar9 != iVar13; lVar9 = lVar9 + 1) {
          if ((lVar9 < lVar11 + -1) && (hdl->blk_num[lVar9] <= hdl->index[lVar9])) {
            lVar8 = hdl->blk_inc[lVar9 + 1];
            hdl->index[lVar9] = hdl->proc_index[lVar9];
            hdl->index[lVar9 + 1] = hdl->index[lVar9 + 1] + lVar8;
          }
        }
        return 1;
      }
    }
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int pnga_local_iterator_next(_iterator_hdl *hdl, Integer plo[],
    Integer phi[], char **ptr, Integer ld[])
{
  Integer i;
  Integer handle = GA_OFFSET + hdl->g_a;
  Integer grp = GA[handle].p_handle;
  Integer elemsize = GA[handle].elemsize;
  int ndim;
  int me = pnga_pgroup_nodeid(grp);
  ndim = GA[handle].ndim;
  if (GA[handle].distr_type == REGULAR) {
    Integer nelems;
    /* no blocks left, so return */
    if (hdl->count>0) return 0;

    /* Find  visible portion of patch held by this processor and
     * return the result in plo and phi. Return pointer to local
     * data as well
     */
    pnga_distribution(hdl->g_a, me, plo, phi);
    /* Check to see if this process has any data. Return 0 if
     * it does not */
    for (i=0; i<ndim; i++) {
      if (phi[i]<plo[i]) return 0;
    }
    pnga_access_ptr(hdl->g_a,plo,phi,ptr,ld);
    hdl->count++;
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* Simple block-cyclic distribution */
    if (hdl->count >= pnga_total_blocks(hdl->g_a)) return 0;
    pnga_distribution(hdl->g_a,hdl->count,plo,phi);
    pnga_access_block_ptr(hdl->g_a,hdl->count,ptr,ld);
    hdl->count += pnga_pgroup_nnodes(grp);
  } else if (GA[handle].distr_type == SCALAPACK ||
      GA[handle].distr_type == TILED) {
    /* Scalapack-type data distribution */
    if (hdl->index[ndim-1] >= hdl->blk_num[ndim-1]) return 0;
    /* Find coordinates of bounding block */
    for (i=0; i<ndim; i++) {
      plo[i] = hdl->index[i]*hdl->blk_size[i]+1;
      phi[i] = (hdl->index[i]+1)*hdl->blk_size[i];
      if (phi[i] > hdl->blk_dim[i]) phi[i] = hdl->blk_dim[i];
    }
    pnga_access_block_grid_ptr(hdl->g_a,hdl->index,ptr,ld);
    hdl->index[0] += hdl->blk_inc[0];
    for (i=0; i<ndim; i++) {
      if (hdl->index[i] >= hdl->blk_num[i] && i<ndim-1) {
        hdl->index[i] = hdl->proc_index[i];
        hdl->index[i+1] += hdl->blk_inc[i+1];
      }
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* Irregular tiled data distribution */
    Integer offset = 0;
    if (hdl->index[ndim-1] >= hdl->blk_num[ndim-1]) return 0;
    /* Find coordinates of bounding block */
    for (i=0; i<ndim; i++) {
      plo[i] = hdl->mapc[offset+hdl->index[i]];
      if (hdl->index[i] < hdl->blk_num[i]-1) {
        phi[i] = hdl->mapc[offset+hdl->index[i]+1]-1;
      } else {
        phi[i] = GA[handle].dims[i];
      }
      offset += GA[handle].num_blocks[i];
    }
    pnga_access_block_grid_ptr(hdl->g_a,hdl->index,ptr,ld);
    hdl->index[0] += hdl->blk_inc[0];
    for (i=0; i<ndim; i++) {
      if (hdl->index[i] >= hdl->blk_num[i] && i<ndim-1) {
        hdl->index[i] = hdl->proc_index[i];
        hdl->index[i+1] += hdl->blk_inc[i+1];
      }
    }
  }
  return 1;
}